

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

uv_signal_t * uv__signal_first_handle(int signum)

{
  int iVar1;
  long lVar2;
  uv_signal_t *puVar3;
  uv__signal_tree_s w2;
  uv_signal_t lookup;
  uv_signal_t uStack_b8;
  
  uStack_b8.flags = 0;
  uStack_b8.loop = (uv_loop_t *)0x0;
  if (uv__signal_tree.rbh_root != (uv_signal_s *)0x0) {
    puVar3 = (uv_signal_t *)0x0;
    w2.rbh_root = uv__signal_tree.rbh_root;
    uStack_b8.signum = signum;
    do {
      iVar1 = uv__signal_compare(&uStack_b8,w2.rbh_root);
      if (iVar1 < 0) {
        lVar2 = 0x70;
        puVar3 = w2.rbh_root;
      }
      else {
        lVar2 = 0x78;
        if (iVar1 == 0) goto LAB_0053229f;
      }
      w2.rbh_root = *(uv_signal_s **)((long)(w2.rbh_root)->handle_queue + lVar2 + -0x20);
    } while (w2.rbh_root != (uv_signal_t *)0x0);
    w2.rbh_root = puVar3;
    if (puVar3 != (uv_signal_t *)0x0) {
LAB_0053229f:
      if ((w2.rbh_root)->signum == signum) {
        return w2.rbh_root;
      }
    }
  }
  return (uv_signal_t *)0x0;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.flags = 0;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}